

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverLines.cpp
# Opt level: O0

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver6L<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                   *__return_storage_ptr__,
                  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          *plPair,
                  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                  *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                         *lCPair)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  reference pvVar6;
  Scalar *__x;
  Scalar *__y;
  Scalar *pSVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  complex<double> *this;
  double dVar10;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>
  PVar11;
  XprTypeNested XVar12;
  Type TStack_430d8;
  Type TStack_430a0;
  non_const_type pMStack_43068;
  non_const_type pMStack_43060;
  Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>
  PStack_43058;
  XprTypeNested XStack_43048;
  Product<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>
  PStack_43038;
  Product<Eigen::Product<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
  PStack_43020;
  ColXpr CStack_43000;
  Type TStack_42fd0;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>
  PStack_42f70;
  RowXpr RStack_42f08;
  ColXpr CStack_42ed8;
  Type TStack_42ea8;
  ColXpr CStack_42e48;
  Type TStack_42e18;
  TransposeReturnType TStack_42db8;
  Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  PStack_42d58;
  Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>
  PStack_42cf0;
  ColXpr CStack_42c28;
  Type TStack_42bf8;
  ColXpr CStack_42b98;
  Type TStack_42b68;
  TransposeReturnType TStack_42b08;
  Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  PStack_42aa8;
  Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>
  PStack_42a40;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>_>
  CStack_42978;
  NegativeReturnType NStack_427e0;
  uint uStack_42634;
  undefined1 auStack_42630 [4];
  uint iter;
  non_const_type pMStack_425e8;
  undefined1 auStack_425e0 [8];
  complex<double> temp;
  undefined1 auStack_425c8 [4];
  int r;
  Matrix<double,_3,_1,_0,_3,_1> solution;
  int c;
  bool isComplex;
  Matrix<std::complex<double>,_64,_64,_0,_64,_64> EV;
  EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> Eig;
  double d23;
  double d22;
  double d21;
  double d13;
  double d12;
  double d11;
  undefined1 local_9938 [8];
  Matrix<double,_4,_4,_0,_4,_4> TransformationEstimate;
  undefined1 local_98b0 [8];
  Matrix<double,_3,_1,_0,_3,_1> TranslationEstimate;
  Matrix<double,_3,_3,_0,_3,_3> RotationEstimate;
  Matrix<double,_3,_1,_0,_3,_1> eD2;
  Matrix<double,_6,_1,_0,_6,_1> k;
  Matrix<double,_6,_3,_0,_6,_3> A;
  undefined1 local_9768 [8];
  Matrix<double,_64,_64,_0,_64,_64> Action;
  value_type local_1738;
  ColXpr local_1708;
  value_type local_16d8;
  int local_169c;
  undefined1 local_1698 [4];
  int i;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  L2vec;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  L1vec;
  ColXpr local_1638;
  ColXpr local_1608;
  ColXpr local_15d8;
  ColXpr local_15a8;
  ColXpr local_1578;
  ColXpr local_1548;
  ColXpr local_1518;
  ColXpr local_14e8;
  ColXpr local_14b8;
  ColXpr local_1488;
  ColXpr local_1458;
  undefined1 local_1428 [8];
  Matrix<double,_6,_6,_0,_6,_6> L3;
  Matrix<double,_6,_6,_0,_6,_6> L2;
  Matrix<double,_6,_6,_0,_6,_6> L1;
  RealScalar local_1090;
  type local_1088;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_1070;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_1058;
  Type local_1038;
  RealScalar local_1000;
  type local_ff8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_fe0;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_fc8;
  Type local_fa8;
  RealScalar local_f70;
  type local_f68;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_f50;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_f38;
  Type local_f18;
  RealScalar local_ee0;
  type local_ed8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_ec0;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_ea8;
  Type local_e88;
  RealScalar local_e50;
  type local_e48;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_e30;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_e18;
  Type local_df8;
  RealScalar local_dc0;
  type local_db8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_da0;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_d88;
  Type local_d68;
  RealScalar local_d30;
  type local_d28;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_d10;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_cf8;
  Type local_cd8;
  RealScalar local_ca0;
  type local_c98;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_c80;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_c68;
  Type local_c48;
  RealScalar local_c10;
  type local_c08;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_bf0;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_bd8;
  Type local_bb8;
  RealScalar local_b80;
  type local_b78;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_b60;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_b48;
  Type local_b28;
  RealScalar local_af0;
  type local_ae8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_ad0;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_ab8;
  Type local_a98;
  RealScalar local_a60;
  type local_a58;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_a40;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_a28;
  undefined1 local_a08 [8];
  Matrix<double,_6,_1,_0,_6,_1> L62;
  Matrix<double,_6,_1,_0,_6,_1> L61;
  Matrix<double,_6,_1,_0,_6,_1> L52;
  Matrix<double,_6,_1,_0,_6,_1> L51;
  Matrix<double,_6,_1,_0,_6,_1> L42;
  Matrix<double,_6,_1,_0,_6,_1> L41;
  Matrix<double,_6,_1,_0,_6,_1> L32;
  Matrix<double,_6,_1,_0,_6,_1> L31;
  Matrix<double,_6,_1,_0,_6,_1> L22;
  Matrix<double,_6,_1,_0,_6,_1> L21;
  Matrix<double,_6,_1,_0,_6,_1> L12;
  Matrix<double,_6,_1,_0,_6,_1> L11;
  Type local_790;
  Type local_758;
  Type local_720;
  Type local_6e8;
  Type local_6b0;
  Type local_678;
  Type local_640;
  Type local_608;
  Type local_5d0;
  Type local_598;
  Type local_560;
  Type local_528;
  Type local_4f0;
  Type local_4b8;
  Type local_480;
  Type local_448;
  Type local_410;
  Type local_3d8;
  Type local_3a0;
  Type local_368;
  Type local_330;
  Type local_2f8;
  Type local_2c0;
  undefined1 local_288 [8];
  Matrix<double,_3,_1,_0,_3,_1> R62_B;
  Matrix<double,_3,_1,_0,_3,_1> R61_B;
  Matrix<double,_3,_1,_0,_3,_1> Q62;
  Matrix<double,_3,_1,_0,_3,_1> Q61;
  Matrix<double,_3,_1,_0,_3,_1> R52_B;
  Matrix<double,_3,_1,_0,_3,_1> R51_B;
  Matrix<double,_3,_1,_0,_3,_1> Q52;
  Matrix<double,_3,_1,_0,_3,_1> Q51;
  Matrix<double,_3,_1,_0,_3,_1> R42_B;
  Matrix<double,_3,_1,_0,_3,_1> R41_B;
  Matrix<double,_3,_1,_0,_3,_1> Q42;
  Matrix<double,_3,_1,_0,_3,_1> Q41;
  Matrix<double,_3,_1,_0,_3,_1> R32_B;
  Matrix<double,_3,_1,_0,_3,_1> R31_B;
  Matrix<double,_3,_1,_0,_3,_1> Q32;
  Matrix<double,_3,_1,_0,_3,_1> Q31;
  Matrix<double,_3,_1,_0,_3,_1> R22_B;
  Matrix<double,_3,_1,_0,_3,_1> R21_B;
  Matrix<double,_3,_1,_0,_3,_1> Q22;
  Matrix<double,_3,_1,_0,_3,_1> Q21;
  Matrix<double,_3,_1,_0,_3,_1> R12_B;
  Matrix<double,_3,_1,_0,_3,_1> R11_B;
  Matrix<double,_3,_1,_0,_3,_1> Q12;
  undefined1 local_50 [8];
  Matrix<double,_3,_1,_0,_3,_1> Q11;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  *lCPair_local;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  *lPair_local;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  *plPair_local;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  *ptPair_local;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  *solutions;
  
  Q11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]._7_1_ =
       0;
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::vector(__return_storage_ptr__);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_50);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (R11_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (R12_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (Q21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (Q22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (R21_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (R22_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (Q31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (Q32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (R31_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (R32_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (Q41.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (Q42.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (R41_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (R42_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (Q51.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (Q52.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (R51_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (R52_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (Q61.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (Q62.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (R61_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (R62_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_288);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,0);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_2c0,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)pvVar6,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)local_50,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_2c0);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,0);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_2f8,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&(pvVar6->first).second,
             3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (R11_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_2f8);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,0);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_330,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&pvVar6->second,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (R12_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_330);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,0);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_368,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&(pvVar6->second).second
             ,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (Q21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_368);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,1);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_3a0,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)pvVar6,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (Q22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_3a0);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,1);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_3d8,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&(pvVar6->first).second,
             3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (R21_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_3d8);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,1);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_410,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&pvVar6->second,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (R22_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_410);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,1);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_448,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&(pvVar6->second).second
             ,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (Q31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_448);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,2);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_480,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)pvVar6,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (Q32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_480);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,2);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_4b8,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&(pvVar6->first).second,
             3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (R31_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_4b8);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,2);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_4f0,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&pvVar6->second,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (R32_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_4f0);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,2);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_528,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&(pvVar6->second).second
             ,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (Q41.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_528);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,3);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_560,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)pvVar6,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (Q42.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_560);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,3);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_598,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&(pvVar6->first).second,
             3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (R41_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_598);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,3);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_5d0,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&pvVar6->second,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (R42_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_5d0);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,3);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_608,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&(pvVar6->second).second
             ,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (Q51.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_608);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,4);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_640,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)pvVar6,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (Q52.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_640);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,4);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_678,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&(pvVar6->first).second,
             3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (R51_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_678);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,4);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_6b0,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&pvVar6->second,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (R52_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_6b0);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,4);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_6e8,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&(pvVar6->second).second
             ,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (Q61.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_6e8);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,5);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_720,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)pvVar6,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (Q62.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_720);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,5);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_758,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&(pvVar6->first).second,
             3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (R61_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_758);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,5);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            (&local_790,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&pvVar6->second,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             (R62_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_790);
  pvVar6 = std::
           vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lPair,5);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)(L11.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array + 5),
             (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&(pvVar6->second).second,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)local_288,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             (L11.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<double,_6,_1,_0,_6,_1> *)
             (L12.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<double,_6,_1,_0,_6,_1> *)
             (L21.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<double,_6,_1,_0,_6,_1> *)
             (L22.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<double,_6,_1,_0,_6,_1> *)
             (L31.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<double,_6,_1,_0,_6,_1> *)
             (L32.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<double,_6,_1,_0,_6,_1> *)
             (L41.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<double,_6,_1,_0,_6,_1> *)
             (L42.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<double,_6,_1,_0,_6,_1> *)
             (L51.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<double,_6,_1,_0,_6,_1> *)
             (L52.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<double,_6,_1,_0,_6,_1> *)
             (L61.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<double,_6,_1,_0,_6,_1> *)
             (L62.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_a08);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_a40,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (R11_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_50);
  Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::operator<<
            (&local_a28,
             (DenseBase<Eigen::Matrix<double,6,1,0,6,1>> *)
             (L12.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_a40);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_a58,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_50,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (R11_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&local_a28,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_a58);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_a28);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            (&local_a98,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L12.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),3);
  local_a60 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_a98);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L12.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),&local_a60);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_ad0,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (Q21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (R12_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::operator<<
            (&local_ab8,
             (DenseBase<Eigen::Matrix<double,6,1,0,6,1>> *)
             (L21.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_ad0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_ae8,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (R12_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (Q21.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&local_ab8,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_ae8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_ab8);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            (&local_b28,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L21.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),3);
  local_af0 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_b28);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L21.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),&local_af0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_b60,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (R21_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (Q22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::operator<<
            (&local_b48,
             (DenseBase<Eigen::Matrix<double,6,1,0,6,1>> *)
             (L22.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_b60);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_b78,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (Q22.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (R21_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&local_b48,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_b78);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_b48);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            (&local_bb8,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L22.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),3);
  local_b80 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_bb8);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L22.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),&local_b80);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_bf0,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (Q31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (R22_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::operator<<
            (&local_bd8,
             (DenseBase<Eigen::Matrix<double,6,1,0,6,1>> *)
             (L31.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_bf0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_c08,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (R22_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (Q31.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&local_bd8,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_c08);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_bd8);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            (&local_c48,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L31.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),3);
  local_c10 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_c48);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L31.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),&local_c10);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_c80,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (R31_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (Q32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::operator<<
            (&local_c68,
             (DenseBase<Eigen::Matrix<double,6,1,0,6,1>> *)
             (L32.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_c80);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_c98,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (Q32.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (R31_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&local_c68,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_c98);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_c68);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            (&local_cd8,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L32.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),3);
  local_ca0 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_cd8);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L32.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),&local_ca0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_d10,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (Q41.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (R32_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::operator<<
            (&local_cf8,
             (DenseBase<Eigen::Matrix<double,6,1,0,6,1>> *)
             (L41.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_d10);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_d28,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (R32_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (Q41.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&local_cf8,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_d28);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_cf8);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            (&local_d68,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L41.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),3);
  local_d30 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_d68);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L41.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),&local_d30);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_da0,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (R41_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (Q42.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::operator<<
            (&local_d88,
             (DenseBase<Eigen::Matrix<double,6,1,0,6,1>> *)
             (L42.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_da0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_db8,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (Q42.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (R41_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&local_d88,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_db8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_d88);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            (&local_df8,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L42.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),3);
  local_dc0 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_df8);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L42.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),&local_dc0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_e30,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (Q51.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (R42_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::operator<<
            (&local_e18,
             (DenseBase<Eigen::Matrix<double,6,1,0,6,1>> *)
             (L51.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_e30);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_e48,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (R42_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (Q51.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&local_e18,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_e48);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_e18);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            (&local_e88,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L51.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),3);
  local_e50 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_e88);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L51.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),&local_e50);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_ec0,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (R51_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (Q52.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::operator<<
            (&local_ea8,
             (DenseBase<Eigen::Matrix<double,6,1,0,6,1>> *)
             (L52.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_ec0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_ed8,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (Q52.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (R51_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&local_ea8,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_ed8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_ea8);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            (&local_f18,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L52.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),3);
  local_ee0 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_f18);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L52.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),&local_ee0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_f50,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (Q61.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (R52_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::operator<<
            (&local_f38,
             (DenseBase<Eigen::Matrix<double,6,1,0,6,1>> *)
             (L61.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_f50);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_f68,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (R52_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (Q61.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&local_f38,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_f68);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_f38);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            (&local_fa8,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L61.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),3);
  local_f70 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                   &local_fa8);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L61.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),&local_f70);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_fe0,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (R61_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (Q62.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::operator<<
            (&local_fc8,
             (DenseBase<Eigen::Matrix<double,6,1,0,6,1>> *)
             (L62.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_fe0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_ff8,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (Q62.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (R61_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&local_fc8,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_ff8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_fc8);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            (&local_1038,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L62.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),3);
  local_1000 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
               ::norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&local_1038);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L62.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5),&local_1000);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_1070,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_288,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (R62_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::operator<<
            (&local_1058,(DenseBase<Eigen::Matrix<double,6,1,0,6,1>> *)local_a08,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_1070);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_1088,
             (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             (R62_B.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_288);
  Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&local_1058,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_1088);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::~CommaInitializer(&local_1058);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)(L1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                      m_data.array + 0x23),
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a08,3);
  local_1090 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>_>
               ::norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)(L1.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array + 0x23));
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a08,&local_1090);
  Eigen::Matrix<double,_6,_6,_0,_6,_6>::Matrix
            ((Matrix<double,_6,_6,_0,_6,_6> *)
             (L2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x23));
  Eigen::Matrix<double,_6,_6,_0,_6,_6>::Matrix
            ((Matrix<double,_6,_6,_0,_6,_6> *)
             (L3.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x23));
  Eigen::Matrix<double,_6,_6,_0,_6,_6>::Matrix((Matrix<double,_6,_6,_0,_6,_6> *)local_1428);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
            (&local_1458,
             (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
             (L3.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x23),0);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true> *)&local_1458,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L12.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
            (&local_1488,
             (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
             (L2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x23),0);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true> *)&local_1488,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L21.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
            (&local_14b8,
             (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
             (L3.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x23),1);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true> *)&local_14b8,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L22.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
            (&local_14e8,
             (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
             (L2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x23),1);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true> *)&local_14e8,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L31.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
            (&local_1518,
             (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
             (L3.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x23),2);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true> *)&local_1518,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L32.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
            (&local_1548,
             (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
             (L2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x23),2);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true> *)&local_1548,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L41.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
            (&local_1578,
             (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
             (L3.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x23),3);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true> *)&local_1578,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L42.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
            (&local_15a8,
             (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
             (L2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x23),3);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true> *)&local_15a8,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L51.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
            (&local_15d8,
             (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
             (L3.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x23),4);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true> *)&local_15d8,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L52.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
            (&local_1608,
             (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
             (L2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x23),4);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true> *)&local_1608,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L61.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
            (&local_1638,
             (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
             (L3.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x23),5);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true> *)&local_1638,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (L62.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
              array + 5));
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
            ((ColXpr *)
             &L1vec.
              super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
             (L2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             + 0x23),5);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>::operator=
            ((Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true> *)
             &L1vec.
              super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_a08);
  std::
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            *)&L2vec.
               super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            *)local_1698);
  for (local_169c = 0; local_169c < 6; local_169c = local_169c + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
              (&local_1708,
               (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
               (L2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23),(long)local_169c);
    Eigen::Matrix<double,6,1,0,6,1>::Matrix<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>>
              ((Matrix<double,6,1,0,6,1> *)&local_16d8,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
               &local_1708);
    std::
    vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 *)&L2vec.
                    super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_16d8);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
              ((ColXpr *)
               (Action.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                m_data.array + 0xfff),
               (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
               (L3.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x23),(long)local_169c);
    Eigen::Matrix<double,6,1,0,6,1>::Matrix<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>>
              ((Matrix<double,6,1,0,6,1> *)&local_1738,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
               (Action.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                m_data.array + 0xfff));
    std::
    vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 *)local_1698,&local_1738);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>::Zero();
  Eigen::Matrix<double,64,64,0,64,64>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,64,0,64,64>>>
            ((Matrix<double,64,64,0,64,64> *)local_9768,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_64,_64,_0,_64,_64>_>_>
              *)(A.super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage.m_data.
                 array + 0x11));
  setupAction<double>((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                       *)&L2vec.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                       *)local_1698,(Matrix<double,_64,_64,_0,_64,_64> *)local_9768);
  Eigen::Matrix<double,_6,_3,_0,_6,_3>::Matrix
            ((Matrix<double,_6,_3,_0,_6,_3> *)
             (k.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 5));
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<double,_6,_1,_0,_6,_1> *)
             (eD2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (RotationEstimate.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
              m_storage.m_data.array + 8));
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<double,_3,_3,_0,_3,_3> *)
             (TranslationEstimate.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_98b0);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity
            ((IdentityReturnType *)((long)&d11 + 5),4,4);
  Eigen::Matrix<double,4,4,0,4,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
            ((Matrix<double,4,4,0,4,4> *)local_9938,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              *)((long)&d11 + 5));
  Eigen::EigenSolver<Eigen::Matrix<double,64,64,0,64,64>>::
  EigenSolver<Eigen::Matrix<double,64,64,0,64,64>>
            ((EigenSolver<Eigen::Matrix<double,64,64,0,64,64>> *)
             (EV.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[0xfff]._M_value + 8),
             (EigenBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> *)local_9768,true);
  Eigen::EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>::eigenvectors
            ((EigenvectorsType *)&c,
             (EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> *)
             (EV.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[0xfff]._M_value + 8));
  solution.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2].
  _7_1_ = 0;
  std::
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ::reserve(__return_storage_ptr__,0x40);
  for (solution.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2]._0_4_ = 0;
      solution.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2]._0_4_ < 0x40;
      solution.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2]._0_4_ = solution.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2]._0_4_ + 1) {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)auStack_425c8);
    for (temp._M_value._12_4_ = 0; (int)temp._M_value._12_4_ < 3;
        temp._M_value._12_4_ = temp._M_value._12_4_ + 1) {
      __x = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_64,_64,_0,_64,_64>,_1>::
            operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_64,_64,_0,_64,_64>,_1> *
                       )&c,(long)(temp._M_value._12_4_ + 0x3c),
                       (long)solution.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array[2]._0_4_);
      __y = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_64,_64,_0,_64,_64>,_1>::
            operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_64,_64,_0,_64,_64>,_1> *
                       )&c,0x3f,(long)solution.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                      m_storage.m_data.array[2]._0_4_);
      std::operator/(__x,__y);
      temp._M_value._0_8_ = in_XMM1_Qa;
      dVar10 = std::complex<double>::real_abi_cxx11_((complex<double> *)auStack_425e0);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)auStack_425c8,
                          (long)(int)temp._M_value._12_4_);
      *pSVar7 = dVar10;
      this = (complex<double> *)auStack_425e0;
      std::complex<double>::imag_abi_cxx11_(this);
      std::abs((int)this);
      in_XMM1_Qa = 1e-06;
      if (1e-06 <= extraout_XMM0_Qa) {
        solution.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2]._7_1_ = 1;
      }
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)auStack_425c8,
                          (long)(int)temp._M_value._12_4_);
      uVar5 = std::isnan(*pSVar7);
      if ((uVar5 & 1) != 0) {
        solution.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [2]._7_1_ = 1;
      }
    }
    if ((solution.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2]._7_1_ & 1) == 0) {
      cayley2rot<double>((Matrix<double,_3,_3,_0,_3,_3> *)auStack_42630,
                         (Matrix<double,_3,_1,_0,_3,_1> *)auStack_425c8);
      pMStack_425e8 =
           (non_const_type)
           Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                     ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)auStack_42630);
      Eigen::Matrix<double,3,3,0,3,3>::operator=
                ((Matrix<double,3,3,0,3,3> *)
                 (TranslationEstimate.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 2),
                 (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                 &pMStack_425e8);
      for (uStack_42634 = 0; uStack_42634 < 6; uStack_42634 = uStack_42634 + 1) {
        Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
                  (&CStack_42b98,
                   (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                   (L2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                    .array + 0x23),(ulong)uStack_42634);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>_>::tail<int>
                  (&TStack_42b68,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
                   &CStack_42b98,3);
        Eigen::
        DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>
        ::transpose(&TStack_42b08,
                    (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>
                     *)&TStack_42b68);
        Eigen::
        MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>,-1,1,false>>>
        ::operator*(&PStack_42aa8,
                    (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>,_1,1,false>>>
                     *)&TStack_42b08,
                    (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                    (TranslationEstimate.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array + 2));
        Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
                  (&CStack_42c28,
                   (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                   (L3.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                    .array + 0x23),(ulong)uStack_42634);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>_>::head<int>
                  (&TStack_42bf8,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
                   &CStack_42c28,3);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>,-1,1,false>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
        ::operator*(&PStack_42a40,
                    (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>,_1,1,false>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                     *)&PStack_42aa8,
                    (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>
                     *)&TStack_42bf8);
        Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
                  (&CStack_42e48,
                   (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                   (L2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                    .array + 0x23),(ulong)uStack_42634);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>_>::head<int>
                  (&TStack_42e18,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
                   &CStack_42e48,3);
        Eigen::
        DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>
        ::transpose(&TStack_42db8,
                    (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>
                     *)&TStack_42e18);
        Eigen::
        MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>,-1,1,false>>>
        ::operator*(&PStack_42d58,
                    (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>,_1,1,false>>>
                     *)&TStack_42db8,
                    (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                    (TranslationEstimate.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array + 2));
        Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
                  (&CStack_42ed8,
                   (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                   (L3.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                    .array + 0x23),(ulong)uStack_42634);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>_>::tail<int>
                  (&TStack_42ea8,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
                   &CStack_42ed8,3);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>,-1,1,false>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
        ::operator*(&PStack_42cf0,
                    (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>,_1,1,false>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                     *)&PStack_42d58,
                    (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>
                     *)&TStack_42ea8);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>,-1,1,false>>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>,-1,1,false>,0>>
        ::operator+(&CStack_42978,
                    (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>,_1,1,false>>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,6,1,true>,_1,1,false>,0>>
                     *)&PStack_42a40,
                    (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>_>
                     *)&PStack_42cf0);
        Eigen::
        DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>,_0>_>_>
        ::operator-(&NStack_427e0,
                    (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>_>_>
                     *)&CStack_42978);
        Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::row
                  (&RStack_42f08,
                   (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                   (eD2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array + 2),(ulong)uStack_42634);
        Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,1,1,false>::operator=
                  ((Block<Eigen::Matrix<double,6,1,0,6,1>,1,1,false> *)&RStack_42f08,
                   (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>_>_>_>
                    *)&NStack_427e0);
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1> *)
                            (L2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                             m_storage.m_data.array + 0x23),0,(ulong)uStack_42634);
        in_XMM1_Qa = *pSVar8;
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1> *)
                            (L2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                             m_storage.m_data.array + 0x23),1,(ulong)uStack_42634);
        dVar10 = *pSVar8;
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_1> *)
                            (L2.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                             m_storage.m_data.array + 0x23),2,(ulong)uStack_42634);
        dVar1 = *pSVar8;
        Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::col
                  (&CStack_43000,
                   (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                   (L3.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                    .array + 0x23),(ulong)uStack_42634);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>_>::head<int>
                  (&TStack_42fd0,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
                   &CStack_43000,3);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  (&PStack_42f70,
                   (MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
                   (TranslationEstimate.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    .m_storage.m_data.array + 2),
                   (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>
                    *)&TStack_42fd0);
        Eigen::Matrix<double,3,1,0,3,1>::operator=
                  ((Matrix<double,3,1,0,3,1> *)
                   (RotationEstimate.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array + 8),
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>_>
                    *)&PStack_42f70);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                            (RotationEstimate.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + 8),0);
        dVar2 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                            (RotationEstimate.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + 8),1);
        dVar3 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                            (RotationEstimate.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + 8),2);
        dVar4 = *pSVar7;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                            (k.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array + 5),(ulong)uStack_42634,0);
        *pSVar9 = dVar1 * dVar3 - dVar10 * dVar4;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                            (k.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array + 5),(ulong)uStack_42634,1);
        *pSVar9 = in_XMM1_Qa * dVar4 - dVar1 * dVar2;
        in_XMM1_Qa = in_XMM1_Qa * dVar3;
        dVar10 = dVar10 * dVar2 - in_XMM1_Qa;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_1> *)
                            (k.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array + 5),(ulong)uStack_42634,2);
        *pSVar9 = dVar10;
      }
      pMStack_43060 =
           (non_const_type)
           Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                     ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                      (k.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array + 5));
      PVar11 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>>::operator*
                         ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>> *)
                          &pMStack_43060,
                          (MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                          (k.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array + 5));
      PStack_43058 = PVar11;
      XVar12 = (XprTypeNested)
               Eigen::
               MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>
               ::inverse((MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>
                          *)&PStack_43058);
      XStack_43048 = XVar12;
      pMStack_43068 =
           (non_const_type)
           Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                     ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                      (k.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array + 5));
      Eigen::
      MatrixBase<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,3,0,6,3>,0>>>
      ::operator*(&PStack_43038,
                  (MatrixBase<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,3,0,6,3>,0>>>
                   *)&XStack_43048,
                  (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *)
                  &pMStack_43068);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,3,0,6,3>,0>>,Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,0>>
      ::operator*(&PStack_43020,
                  (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,3,0,6,3>,0>>,Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,0>>
                   *)&PStack_43038,
                  (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                  (eD2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                   .array + 2));
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)local_98b0,
                 (DenseBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)&PStack_43020);
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                (&TStack_430a0,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_9938,3,3);
      Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&TStack_430a0,
                 (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                 (TranslationEstimate.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 2));
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
                (&TStack_430d8,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_9938,3,1);
      Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false> *)&TStack_430d8,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_98b0);
      std::
      vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_9938);
    }
    else {
      solution.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2]._7_1_ = 0;
    }
  }
  Q11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]._7_1_ =
       1;
  std::
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             *)local_1698);
  std::
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             *)&L2vec.
                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((Q11.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2].
       _7_1_ & 1) == 0) {
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Eigen::Matrix<floatPrec,4,4>> solver6L(
  std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
  std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair
  )
{

  std::vector<Eigen::Matrix<floatPrec,4,4>> solutions;

  // parse inputs
	Eigen::Matrix<floatPrec,3,1> Q11, Q12, R11_B, R12_B, Q21, Q22, R21_B, R22_B, 
  Q31, Q32, R31_B, R32_B, Q41, Q42, R41_B, R42_B, Q51, Q52, R51_B, R52_B, Q61, Q62, R61_B, R62_B;
	
	Q11   = lPair[0].first.first.head(3);  Q12   = lPair[0].first.second.head(3);
	R11_B = lPair[0].second.first.head(3); R12_B = lPair[0].second.second.head(3);
	Q21   = lPair[1].first.first.head(3);  Q22   = lPair[1].first.second.head(3);
	R21_B = lPair[1].second.first.head(3); R22_B = lPair[1].second.second.head(3);
	Q31   = lPair[2].first.first.head(3);  Q32   = lPair[2].first.second.head(3);
	R31_B = lPair[2].second.first.head(3); R32_B = lPair[2].second.second.head(3);
  Q41   = lPair[3].first.first.head(3);  Q42   = lPair[3].first.second.head(3);
	R41_B = lPair[3].second.first.head(3); R42_B = lPair[3].second.second.head(3);
	Q51   = lPair[4].first.first.head(3);  Q52   = lPair[4].first.second.head(3);
	R51_B = lPair[4].second.first.head(3); R52_B = lPair[4].second.second.head(3);
	Q61   = lPair[5].first.first.head(3);  Q62   = lPair[5].first.second.head(3);
	R61_B = lPair[5].second.first.head(3); R62_B = lPair[5].second.second.head(3);

  Eigen::Matrix<floatPrec,6,1> L11, L12, L21, L22, L31, L32;
  Eigen::Matrix<floatPrec,6,1> L41, L42, L51, L52, L61, L62;
  L11 << Q12 - Q11, Q11.cross(Q12); L11 /= L11.head(3).norm();
  L12 << R12_B - R11_B, R11_B.cross(R12_B); L12 /= L12.head(3).norm();
  L21 << Q22 - Q21, Q21.cross(Q22); L21 /= L21.head(3).norm();
  L22 << R22_B - R21_B, R21_B.cross(R22_B); L22 /= L22.head(3).norm();
  L31 << Q32 - Q31, Q31.cross(Q32); L31 /= L31.head(3).norm();
  L32 << R32_B - R31_B, R31_B.cross(R32_B); L32 /= L32.head(3).norm();
  L41 << Q42 - Q41, Q41.cross(Q42); L41 /= L41.head(3).norm();
  L42 << R42_B - R41_B, R41_B.cross(R42_B); L42 /= L42.head(3).norm();
  L51 << Q52 - Q51, Q51.cross(Q52); L51 /= L51.head(3).norm();
  L52 << R52_B - R51_B, R51_B.cross(R52_B); L52 /= L52.head(3).norm();
  L61 << Q62 - Q61, Q61.cross(Q62); L61 /= L61.head(3).norm();
  L62 << R62_B - R61_B, R61_B.cross(R62_B); L62 /= L62.head(3).norm();

  Eigen::Matrix<floatPrec,6,6> L1,L2,L3;
  L2.col(0) = L11; L1.col(0) = L12; 
  L2.col(1) = L21; L1.col(1) = L22;
  L2.col(2) = L31; L1.col(2) = L32;
  L2.col(3) = L41; L1.col(3) = L42;
  L2.col(4) = L51; L1.col(4) = L52;
  L2.col(5) = L61; L1.col(5) = L62;
  // L3 = L2;
  // L2 = L1;
  // L1 = L3;

  // std::cout << "Lines in solve6L" << std::endl;
  // std::cout << L1 << std::endl;
  // std::cout << std::endl <<  L2 << std::endl;
  
  //create vectors of Pluecker coordinates
  std::vector< Eigen::Matrix<floatPrec,6,1>, Eigen::aligned_allocator<Eigen::Matrix<floatPrec,6,1> > > L1vec;
  std::vector< Eigen::Matrix<floatPrec,6,1>, Eigen::aligned_allocator<Eigen::Matrix<floatPrec,6,1> > > L2vec;
  for(int i = 0; i < 6; i++ )
  {
    L1vec.push_back( L1.col(i) );
    L2vec.push_back( L2.col(i) );
  }
  
  //setup the action matrix
  Eigen::Matrix<floatPrec,64,64> Action = Eigen::Matrix<floatPrec,64,64>::Zero();
  setupAction<floatPrec>( L1vec, L2vec, Action );
  
  Eigen::Matrix<floatPrec, 6,3> A;
  Eigen::Matrix<floatPrec, 6,1> k;
  Eigen::Matrix<floatPrec, 3,1> eD2;
  Eigen::Matrix<floatPrec, 3,3> RotationEstimate;
  Eigen::Matrix<floatPrec, 3,1> TranslationEstimate;
  Eigen::Matrix<floatPrec, 4,4> TransformationEstimate = Eigen::Matrix<floatPrec, 4,4>::Identity(4,4);
  floatPrec d11, d12, d13, d21, d22, d23;

  
  //finally eigen-decompose the action-matrix and obtain the solutions
  Eigen::EigenSolver< Eigen::Matrix<floatPrec,64,64> > Eig(Action,true);
  Eigen::Matrix<std::complex<floatPrec>,64,64> EV = Eig.eigenvectors();
  
  bool isComplex = false;

  solutions.reserve(64);  
  for( int c = 0; c < 64; c++ )
  {
    Eigen::Matrix<floatPrec,3,1> solution;
    for( int r = 0; r < 3; r++ )
    {
      std::complex<floatPrec> temp = EV(60+r,c)/EV(63,c);
      solution[r] = temp.real(); // should we remove the complex solution????
      if(std::abs(temp.imag()) >= 0.000001 )
        isComplex = true;
      if(std::isnan(solution[r]))
        isComplex = true;
    }

    if(isComplex) isComplex = false; 
    else{
      RotationEstimate = cayley2rot<floatPrec>(solution).transpose();
      for (unsigned int iter = 0; iter < 6 ; iter++){
        k.row(iter) = -(L1.col(iter).tail(3).transpose() * RotationEstimate * L2.col(iter).head(3) +
                      L1.col(iter).head(3).transpose() * RotationEstimate * L2.col(iter).tail(3));

        d11 = L1(0,iter); d12 = L1(1,iter) ; d13 = L1(2,iter);
        eD2 = RotationEstimate*(L2.col(iter).head(3));
        d21 = eD2(0); d22 = eD2(1) ; d23 = eD2(2);

        A(iter,0) =  d13*d22 - d12*d23;
        A(iter,1) = -d13*d21 + d11*d23;
        A(iter,2) =  d12*d21 - d11*d22;
      }

      TranslationEstimate = (A.transpose()*A).inverse()*(A.transpose())*k;

      TransformationEstimate.topLeftCorner(3,3) = RotationEstimate;
      TransformationEstimate.topRightCorner(3,1) = TranslationEstimate;

      solutions.push_back(TransformationEstimate);
    } 
  
    // std::cout << std::endl << std::endl << "the number of solutions that comes out of here are: " << cayley2rot<floatPrec>(solution).transpose() << std::endl << std::endl;
  }


  return solutions;

}